

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::pattern_formatter::handle_flag_<spdlog::details::scoped_padder>
          (pattern_formatter *this,char flag,padding_info padding)

{
  bool bVar1;
  pointer ppVar2;
  pointer pcVar3;
  pointer paVar4;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_338;
  undefined1 local_330 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_328;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_320;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  local_318;
  __single_object unknown_flag;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_308;
  undefined1 local_300 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_2f8;
  undefined1 local_2f0 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_2e8;
  undefined1 local_2e0 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_2d8;
  undefined1 local_2d0 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_2c8;
  undefined1 local_2b9;
  unique_ptr<spdlog::details::ch_formatter,_std::default_delete<spdlog::details::ch_formatter>_>
  local_2b8;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_2b0;
  undefined1 local_2a8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_2a0;
  undefined1 local_298 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_290;
  undefined1 local_288 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_280;
  undefined1 local_278 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_270;
  undefined1 local_268 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_260;
  undefined1 local_258 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_250;
  undefined1 local_248 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_240;
  undefined1 local_238 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_230;
  undefined1 local_228 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_220;
  undefined1 local_218 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_210;
  undefined1 local_208 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_200;
  undefined1 local_1f8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1f0;
  undefined1 local_1e8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1e0;
  undefined1 local_1d8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1d0;
  undefined1 local_1c8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1c0;
  undefined1 local_1b8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1b0;
  undefined1 local_1a8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1a0;
  undefined1 local_198 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_190;
  undefined1 local_188 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_180;
  undefined1 local_178 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_170;
  undefined1 local_168 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_160;
  undefined1 local_158 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_150;
  undefined1 local_148 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_140;
  undefined1 local_138 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_130;
  undefined1 local_128 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_120;
  undefined1 local_118 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_110;
  undefined1 local_108 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_100;
  undefined1 local_f8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_f0;
  undefined1 local_e8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_e0;
  undefined1 local_d8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_d0;
  undefined1 local_c8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_c0;
  undefined1 local_b8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_b0;
  undefined1 local_a8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_a0;
  undefined1 local_98 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_90;
  undefined1 local_88 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_80;
  undefined1 local_78 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_70;
  undefined1 local_68 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_60;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_58 [3];
  unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
  local_40;
  unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
  custom_handler;
  _Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
  local_30;
  iterator it;
  char flag_local;
  pattern_formatter *this_local;
  padding_info padding_local;
  
  padding_local.width_ = padding._8_8_;
  this_local = (pattern_formatter *)padding.width_;
  it.
  super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
  ._M_cur._7_1_ = flag;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
       ::find(&this->custom_handlers_,
              (key_type *)
              ((long)&it.
                      super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
                      ._M_cur + 7));
  custom_handler._M_t.
  super___uniq_ptr_impl<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::custom_flag_formatter_*,_std::default_delete<spdlog::custom_flag_formatter>_>
  .super__Head_base<0UL,_spdlog::custom_flag_formatter_*,_false>._M_head_impl =
       (__uniq_ptr_data<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>,_true,_true>
        )std::
         unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
         ::end(&this->custom_handlers_);
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
                      *)&custom_handler);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false,_false>
                           *)&local_30);
    pcVar3 = std::
             unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
             ::operator->(&ppVar2->second);
    (**(code **)(*(long *)pcVar3 + 0x18))();
    pcVar3 = std::
             unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
             ::operator->(&local_40);
    custom_flag_formatter::set_padding_info(pcVar3,(padding_info *)&this_local);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)local_58,&local_40);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)local_58);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(local_58);
    std::
    unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>::
    ~unique_ptr(&local_40);
  }
  else {
    switch(it.
           super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
           ._M_cur._7_1_) {
    case '!':
      std::
      make_unique<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_2a8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_2a0,
                 (unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_2a8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_2a0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_2a0);
      std::
      unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_2a8);
      break;
    default:
      std::make_unique<spdlog::details::aggregate_formatter>();
      if ((padding_local.width_ & 0x100000000) == 0) {
        paVar4 = std::
                 unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                 ::operator->(&local_318);
        details::aggregate_formatter::add_ch(paVar4,'%');
        paVar4 = std::
                 unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                 ::operator->(&local_318);
        details::aggregate_formatter::add_ch
                  (paVar4,it.
                          super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
                          ._M_cur._7_1_);
        std::
        unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
        ::
        unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>,void>
                  ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                    *)&local_320,&local_318);
        std::
        vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
        ::push_back(&this->formatters_,(value_type *)&local_320);
        std::
        unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
        ::~unique_ptr(&local_320);
      }
      else {
        padding_local.width_._0_5_ = CONCAT14(0,(uint)padding_local.width_);
        std::
        make_unique<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                  ((padding_info *)local_330);
        std::
        unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
        ::
        unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>>,void>
                  ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                    *)&local_328,
                   (unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
                    *)local_330);
        std::
        vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
        ::push_back(&this->formatters_,(value_type *)&local_328);
        std::
        unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
        ::~unique_ptr(&local_328);
        std::
        unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
        ::~unique_ptr((unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
                       *)local_330);
        paVar4 = std::
                 unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                 ::operator->(&local_318);
        details::aggregate_formatter::add_ch
                  (paVar4,it.
                          super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
                          ._M_cur._7_1_);
        std::
        unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
        ::
        unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>,void>
                  ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                    *)&local_338,&local_318);
        std::
        vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
        ::push_back(&this->formatters_,(value_type *)&local_338);
        std::
        unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
        ::~unique_ptr(&local_338);
      }
      std::
      unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
      ::~unique_ptr(&local_318);
      break;
    case '#':
      std::
      make_unique<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_298);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_290,
                 (unique_ptr<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_298);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_290);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_290);
      std::
      unique_ptr<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_298);
      break;
    case '$':
      std::make_unique<spdlog::details::color_stop_formatter,spdlog::details::padding_info&>
                ((padding_info *)local_258);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::color_stop_formatter,std::default_delete<spdlog::details::color_stop_formatter>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_250,
                 (unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
                  *)local_258);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_250);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_250);
      std::
      unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
      ::~unique_ptr((unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
                     *)local_258);
      break;
    case '%':
      local_2b9 = 0x25;
      std::make_unique<spdlog::details::ch_formatter,char>((char *)&local_2b8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::ch_formatter,std::default_delete<spdlog::details::ch_formatter>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_2b0,&local_2b8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_2b0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_2b0);
      std::
      unique_ptr<spdlog::details::ch_formatter,_std::default_delete<spdlog::details::ch_formatter>_>
      ::~unique_ptr(&local_2b8);
      break;
    case '&':
      std::
      make_unique<spdlog::details::mdc_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)&unknown_flag);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::mdc_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::mdc_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_308,
                 (unique_ptr<spdlog::details::mdc_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::mdc_formatter<spdlog::details::scoped_padder>_>_>
                  *)&unknown_flag);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_308);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_308);
      std::
      unique_ptr<spdlog::details::mdc_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::mdc_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::mdc_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::mdc_formatter<spdlog::details::scoped_padder>_>_>
                     *)&unknown_flag);
      break;
    case '+':
      std::make_unique<spdlog::details::full_formatter,spdlog::details::padding_info&>
                ((padding_info *)local_68);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::full_formatter,std::default_delete<spdlog::details::full_formatter>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_60,
                 (unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
                  *)local_68);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_60);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_60);
      std::
      unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
      ::~unique_ptr((unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
                     *)local_68);
      this->need_localtime_ = true;
      break;
    case '@':
      std::
      make_unique<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_268);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_260,
                 (unique_ptr<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_268);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_260);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_260);
      std::
      unique_ptr<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_268);
      break;
    case 'A':
      std::
      make_unique<spdlog::details::A_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_d8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::A_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::A_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_d0,
                 (unique_ptr<spdlog::details::A_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::A_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_d8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_d0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_d0);
      std::
      unique_ptr<spdlog::details::A_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::A_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::A_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::A_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_d8);
      this->need_localtime_ = true;
      break;
    case 'B':
      std::
      make_unique<spdlog::details::B_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_f8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::B_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::B_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_f0,
                 (unique_ptr<spdlog::details::B_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::B_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_f8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_f0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_f0);
      std::
      unique_ptr<spdlog::details::B_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::B_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::B_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::B_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_f8);
      this->need_localtime_ = true;
      break;
    case 'C':
      std::
      make_unique<spdlog::details::C_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_118);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::C_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::C_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_110,
                 (unique_ptr<spdlog::details::C_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::C_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_118);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_110);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_110);
      std::
      unique_ptr<spdlog::details::C_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::C_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::C_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::C_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_118);
      this->need_localtime_ = true;
      break;
    case 'D':
    case 'x':
      std::
      make_unique<spdlog::details::D_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_138);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::D_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::D_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_130,
                 (unique_ptr<spdlog::details::D_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::D_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_138);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_130);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_130);
      std::
      unique_ptr<spdlog::details::D_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::D_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::D_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::D_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_138);
      this->need_localtime_ = true;
      break;
    case 'E':
      std::
      make_unique<spdlog::details::E_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_1d8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::E_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::E_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_1d0,
                 (unique_ptr<spdlog::details::E_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::E_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_1d8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_1d0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_1d0);
      std::
      unique_ptr<spdlog::details::E_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::E_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::E_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::E_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_1d8);
      break;
    case 'F':
      std::
      make_unique<spdlog::details::F_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_1c8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::F_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::F_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_1c0,
                 (unique_ptr<spdlog::details::F_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::F_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_1c8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_1c0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_1c0);
      std::
      unique_ptr<spdlog::details::F_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::F_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::F_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::F_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_1c8);
      break;
    case 'H':
      std::
      make_unique<spdlog::details::H_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_168);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::H_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::H_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_160,
                 (unique_ptr<spdlog::details::H_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::H_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_168);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_160);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_160);
      std::
      unique_ptr<spdlog::details::H_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::H_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::H_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::H_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_168);
      this->need_localtime_ = true;
      break;
    case 'I':
      std::
      make_unique<spdlog::details::I_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_178);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::I_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::I_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_170,
                 (unique_ptr<spdlog::details::I_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::I_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_178);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_170);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_170);
      std::
      unique_ptr<spdlog::details::I_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::I_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::I_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::I_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_178);
      this->need_localtime_ = true;
      break;
    case 'L':
      std::
      make_unique<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_98);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_90,
                 (unique_ptr<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_98);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_90);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_90);
      std::
      unique_ptr<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_98);
      break;
    case 'M':
      std::
      make_unique<spdlog::details::M_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_188);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::M_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::M_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_180,
                 (unique_ptr<spdlog::details::M_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::M_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_188);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_180);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_180);
      std::
      unique_ptr<spdlog::details::M_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::M_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::M_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::M_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_188);
      this->need_localtime_ = true;
      break;
    case 'O':
      std::
      make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1l>>>,spdlog::details::padding_info&>
                ((padding_info *)local_300);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1l>>>,std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1l>>>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_2f8,
                 (unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
                  *)local_300);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_2f8);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_2f8);
      std::
      unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
                     *)local_300);
      break;
    case 'P':
      std::
      make_unique<spdlog::details::pid_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_238);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::pid_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::pid_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_230,
                 (unique_ptr<spdlog::details::pid_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::pid_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_238);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_230);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_230);
      std::
      unique_ptr<spdlog::details::pid_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::pid_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::pid_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::pid_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_238);
      break;
    case 'R':
      std::
      make_unique<spdlog::details::R_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_208);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::R_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::R_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_200,
                 (unique_ptr<spdlog::details::R_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::R_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_208);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_200);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_200);
      std::
      unique_ptr<spdlog::details::R_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::R_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::R_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::R_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_208);
      this->need_localtime_ = true;
      break;
    case 'S':
      std::
      make_unique<spdlog::details::S_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_198);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::S_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::S_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_190,
                 (unique_ptr<spdlog::details::S_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::S_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_198);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_190);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_190);
      std::
      unique_ptr<spdlog::details::S_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::S_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::S_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::S_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_198);
      this->need_localtime_ = true;
      break;
    case 'T':
    case 'X':
      std::
      make_unique<spdlog::details::T_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_218);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::T_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::T_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_210,
                 (unique_ptr<spdlog::details::T_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::T_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_218);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_210);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_210);
      std::
      unique_ptr<spdlog::details::T_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::T_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::T_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::T_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_218);
      this->need_localtime_ = true;
      break;
    case 'Y':
      std::
      make_unique<spdlog::details::Y_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_128);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::Y_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::Y_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_120,
                 (unique_ptr<spdlog::details::Y_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::Y_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_128);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_120);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_120);
      std::
      unique_ptr<spdlog::details::Y_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::Y_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::Y_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::Y_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_128);
      this->need_localtime_ = true;
      break;
    case '^':
      std::make_unique<spdlog::details::color_start_formatter,spdlog::details::padding_info&>
                ((padding_info *)local_248);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::color_start_formatter,std::default_delete<spdlog::details::color_start_formatter>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_240,
                 (unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
                  *)local_248);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_240);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_240);
      std::
      unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
      ::~unique_ptr((unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
                     *)local_248);
      break;
    case 'a':
      std::
      make_unique<spdlog::details::a_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_c8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::a_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::a_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_c0,
                 (unique_ptr<spdlog::details::a_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::a_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_c8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_c0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_c0);
      std::
      unique_ptr<spdlog::details::a_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::a_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::a_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::a_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_c8);
      this->need_localtime_ = true;
      break;
    case 'b':
    case 'h':
      std::
      make_unique<spdlog::details::b_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_e8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::b_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::b_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_e0,
                 (unique_ptr<spdlog::details::b_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::b_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_e8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_e0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_e0);
      std::
      unique_ptr<spdlog::details::b_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::b_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::b_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::b_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_e8);
      this->need_localtime_ = true;
      break;
    case 'c':
      std::
      make_unique<spdlog::details::c_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_108);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::c_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::c_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_100,
                 (unique_ptr<spdlog::details::c_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::c_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_108);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_100);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_100);
      std::
      unique_ptr<spdlog::details::c_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::c_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::c_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::c_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_108);
      this->need_localtime_ = true;
      break;
    case 'd':
      std::
      make_unique<spdlog::details::d_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_158);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::d_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::d_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_150,
                 (unique_ptr<spdlog::details::d_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::d_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_158);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_150);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_150);
      std::
      unique_ptr<spdlog::details::d_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::d_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::d_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::d_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_158);
      this->need_localtime_ = true;
      break;
    case 'e':
      std::
      make_unique<spdlog::details::e_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_1a8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::e_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::e_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_1a0,
                 (unique_ptr<spdlog::details::e_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::e_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_1a8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_1a0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_1a0);
      std::
      unique_ptr<spdlog::details::e_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::e_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::e_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::e_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_1a8);
      break;
    case 'f':
      std::
      make_unique<spdlog::details::f_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_1b8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::f_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::f_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_1b0,
                 (unique_ptr<spdlog::details::f_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::f_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_1b8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_1b0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_1b0);
      std::
      unique_ptr<spdlog::details::f_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::f_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::f_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::f_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_1b8);
      break;
    case 'g':
      std::
      make_unique<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_288);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_280,
                 (unique_ptr<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_288);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_280);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_280);
      std::
      unique_ptr<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_288);
      break;
    case 'i':
      std::
      make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000l>>>,spdlog::details::padding_info&>
                ((padding_info *)local_2e0);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000l>>>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_2d8,
                 (unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>_>
                  *)local_2e0);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_2d8);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_2d8);
      std::
      unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>_>
                     *)local_2e0);
      break;
    case 'l':
      std::
      make_unique<spdlog::details::level_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_88);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::level_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::level_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_80,
                 (unique_ptr<spdlog::details::level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::level_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_88);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_80);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_80);
      std::
      unique_ptr<spdlog::details::level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::level_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::level_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_88);
      break;
    case 'm':
      std::
      make_unique<spdlog::details::m_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_148);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::m_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::m_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_140,
                 (unique_ptr<spdlog::details::m_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::m_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_148);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_140);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_140);
      std::
      unique_ptr<spdlog::details::m_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::m_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::m_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::m_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_148);
      this->need_localtime_ = true;
      break;
    case 'n':
      std::
      make_unique<spdlog::details::name_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_78);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::name_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::name_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_70,
                 (unique_ptr<spdlog::details::name_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::name_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_78);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_70);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_70);
      std::
      unique_ptr<spdlog::details::name_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::name_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::name_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::name_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_78);
      break;
    case 'o':
      std::
      make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000l>>>,spdlog::details::padding_info&>
                ((padding_info *)local_2f0);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000l>>>,std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000l>>>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_2e8,
                 (unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
                  *)local_2f0);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_2e8);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_2e8);
      std::
      unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
                     *)local_2f0);
      break;
    case 'p':
      std::
      make_unique<spdlog::details::p_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_1e8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::p_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::p_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_1e0,
                 (unique_ptr<spdlog::details::p_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::p_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_1e8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_1e0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_1e0);
      std::
      unique_ptr<spdlog::details::p_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::p_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::p_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::p_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_1e8);
      this->need_localtime_ = true;
      break;
    case 'r':
      std::
      make_unique<spdlog::details::r_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_1f8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::r_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::r_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_1f0,
                 (unique_ptr<spdlog::details::r_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::r_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_1f8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_1f0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_1f0);
      std::
      unique_ptr<spdlog::details::r_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::r_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::r_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::r_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_1f8);
      this->need_localtime_ = true;
      break;
    case 's':
      std::
      make_unique<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_278);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_270,
                 (unique_ptr<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_278);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_270);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_270);
      std::
      unique_ptr<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_278);
      break;
    case 't':
      std::
      make_unique<spdlog::details::t_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_a8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::t_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::t_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_a0,
                 (unique_ptr<spdlog::details::t_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::t_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_a8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_a0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_a0);
      std::
      unique_ptr<spdlog::details::t_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::t_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::t_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::t_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_a8);
      break;
    case 'u':
      std::
      make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,spdlog::details::padding_info&>
                ((padding_info *)local_2d0);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_2c8,
                 (unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                  *)local_2d0);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_2c8);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_2c8);
      std::
      unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     *)local_2d0);
      break;
    case 'v':
      std::
      make_unique<spdlog::details::v_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_b8);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::v_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::v_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_b0,
                 (unique_ptr<spdlog::details::v_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::v_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_b8);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_b0);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_b0);
      std::
      unique_ptr<spdlog::details::v_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::v_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::v_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::v_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_b8);
      break;
    case 'z':
      std::
      make_unique<spdlog::details::z_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((padding_info *)local_228);
      std::
      unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
      ::
      unique_ptr<spdlog::details::z_formatter<spdlog::details::scoped_padder>,std::default_delete<spdlog::details::z_formatter<spdlog::details::scoped_padder>>,void>
                ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                  *)&local_220,
                 (unique_ptr<spdlog::details::z_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::z_formatter<spdlog::details::scoped_padder>_>_>
                  *)local_228);
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
      ::push_back(&this->formatters_,(value_type *)&local_220);
      std::
      unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ::~unique_ptr(&local_220);
      std::
      unique_ptr<spdlog::details::z_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::z_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::z_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::z_formatter<spdlog::details::scoped_padder>_>_>
                     *)local_228);
      this->need_localtime_ = true;
    }
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::handle_flag_(char flag, details::padding_info padding) {
    // process custom flags
    auto it = custom_handlers_.find(flag);
    if (it != custom_handlers_.end()) {
        auto custom_handler = it->second->clone();
        custom_handler->set_padding_info(padding);
        formatters_.push_back(std::move(custom_handler));
        return;
    }

    // process built-in flags
    switch (flag) {
        case ('+'):  // default formatter
            formatters_.push_back(details::make_unique<details::full_formatter>(padding));
            need_localtime_ = true;
            break;

        case 'n':  // logger name
            formatters_.push_back(details::make_unique<details::name_formatter<Padder>>(padding));
            break;

        case 'l':  // level
            formatters_.push_back(details::make_unique<details::level_formatter<Padder>>(padding));
            break;

        case 'L':  // short level
            formatters_.push_back(
                details::make_unique<details::short_level_formatter<Padder>>(padding));
            break;

        case ('t'):  // thread id
            formatters_.push_back(details::make_unique<details::t_formatter<Padder>>(padding));
            break;

        case ('v'):  // the message text
            formatters_.push_back(details::make_unique<details::v_formatter<Padder>>(padding));
            break;

        case ('a'):  // weekday
            formatters_.push_back(details::make_unique<details::a_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('A'):  // short weekday
            formatters_.push_back(details::make_unique<details::A_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('b'):
        case ('h'):  // month
            formatters_.push_back(details::make_unique<details::b_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('B'):  // short month
            formatters_.push_back(details::make_unique<details::B_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('c'):  // datetime
            formatters_.push_back(details::make_unique<details::c_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('C'):  // year 2 digits
            formatters_.push_back(details::make_unique<details::C_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('Y'):  // year 4 digits
            formatters_.push_back(details::make_unique<details::Y_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('D'):
        case ('x'):  // datetime MM/DD/YY
            formatters_.push_back(details::make_unique<details::D_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('m'):  // month 1-12
            formatters_.push_back(details::make_unique<details::m_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('d'):  // day of month 1-31
            formatters_.push_back(details::make_unique<details::d_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('H'):  // hours 24
            formatters_.push_back(details::make_unique<details::H_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('I'):  // hours 12
            formatters_.push_back(details::make_unique<details::I_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('M'):  // minutes
            formatters_.push_back(details::make_unique<details::M_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('S'):  // seconds
            formatters_.push_back(details::make_unique<details::S_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('e'):  // milliseconds
            formatters_.push_back(details::make_unique<details::e_formatter<Padder>>(padding));
            break;

        case ('f'):  // microseconds
            formatters_.push_back(details::make_unique<details::f_formatter<Padder>>(padding));
            break;

        case ('F'):  // nanoseconds
            formatters_.push_back(details::make_unique<details::F_formatter<Padder>>(padding));
            break;

        case ('E'):  // seconds since epoch
            formatters_.push_back(details::make_unique<details::E_formatter<Padder>>(padding));
            break;

        case ('p'):  // am/pm
            formatters_.push_back(details::make_unique<details::p_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('r'):  // 12 hour clock 02:55:02 pm
            formatters_.push_back(details::make_unique<details::r_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('R'):  // 24-hour HH:MM time
            formatters_.push_back(details::make_unique<details::R_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('T'):
        case ('X'):  // ISO 8601 time format (HH:MM:SS)
            formatters_.push_back(details::make_unique<details::T_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('z'):  // timezone
            formatters_.push_back(details::make_unique<details::z_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('P'):  // pid
            formatters_.push_back(details::make_unique<details::pid_formatter<Padder>>(padding));
            break;

        case ('^'):  // color range start
            formatters_.push_back(details::make_unique<details::color_start_formatter>(padding));
            break;

        case ('$'):  // color range end
            formatters_.push_back(details::make_unique<details::color_stop_formatter>(padding));
            break;

        case ('@'):  // source location (filename:filenumber)
            formatters_.push_back(
                details::make_unique<details::source_location_formatter<Padder>>(padding));
            break;

        case ('s'):  // short source filename - without directory name
            formatters_.push_back(
                details::make_unique<details::short_filename_formatter<Padder>>(padding));
            break;

        case ('g'):  // full source filename
            formatters_.push_back(
                details::make_unique<details::source_filename_formatter<Padder>>(padding));
            break;

        case ('#'):  // source line number
            formatters_.push_back(
                details::make_unique<details::source_linenum_formatter<Padder>>(padding));
            break;

        case ('!'):  // source funcname
            formatters_.push_back(
                details::make_unique<details::source_funcname_formatter<Padder>>(padding));
            break;

        case ('%'):  // % char
            formatters_.push_back(details::make_unique<details::ch_formatter>('%'));
            break;

        case ('u'):  // elapsed time since last log message in nanos
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::nanoseconds>>(
                    padding));
            break;

        case ('i'):  // elapsed time since last log message in micros
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::microseconds>>(
                    padding));
            break;

        case ('o'):  // elapsed time since last log message in millis
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::milliseconds>>(
                    padding));
            break;

        case ('O'):  // elapsed time since last log message in seconds
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::seconds>>(
                    padding));
            break;

        case ('&'):
            formatters_.push_back(details::make_unique<details::mdc_formatter<Padder>>(padding));
            break;

        default:  // Unknown flag appears as is
            auto unknown_flag = details::make_unique<details::aggregate_formatter>();

            if (!padding.truncate_) {
                unknown_flag->add_ch('%');
                unknown_flag->add_ch(flag);
                formatters_.push_back((std::move(unknown_flag)));
            }
            // fix issue #1617 (prev char was '!' and should have been treated as funcname flag
            // instead of truncating flag) spdlog::set_pattern("[%10!] %v") => "[      main] some
            // message" spdlog::set_pattern("[%3!!] %v") => "[mai] some message"
            else {
                padding.truncate_ = false;
                formatters_.push_back(
                    details::make_unique<details::source_funcname_formatter<Padder>>(padding));
                unknown_flag->add_ch(flag);
                formatters_.push_back((std::move(unknown_flag)));
            }

            break;
    }
}